

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
::get(Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
      *this,double t,vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v,
     TimeSampleInterpolationType tinerp)

{
  bool bVar1;
  TimeCode local_38;
  TimeSampleInterpolationType local_2c;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *pvStack_28;
  TimeSampleInterpolationType tinerp_local;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v_local;
  double t_local;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *this_local;
  
  if (v == (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_2c = tinerp;
    pvStack_28 = v;
    v_local = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)t;
    t_local = (double)this;
    bVar1 = is_blocked(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      tinyusdz::value::TimeCode::TimeCode(&local_38,(double)v_local);
      bVar1 = tinyusdz::value::TimeCode::is_default(&local_38);
      if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
        ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                  (pvStack_28,&this->_value);
        this_local._7_1_ = true;
      }
      else {
        bVar1 = has_timesamples(this);
        if (bVar1) {
          this_local._7_1_ =
               TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
               ::
               get<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_nullptr>
                         (&this->_ts,pvStack_28,(double)v_local,local_2c);
        }
        else {
          bVar1 = has_default(this);
          if (bVar1) {
            this_local._7_1_ = get_scalar(this,pvStack_28);
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }